

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyLink.h
# Opt level: O0

void __thiscall btMultibodyLink::btMultibodyLink(btMultibodyLink *this)

{
  btVector3 *pbVar1;
  btTransform *in_RDI;
  btScalar *in_stack_ffffffffffffff58;
  btMultibodyLink *_z;
  btScalar *in_stack_ffffffffffffff68;
  btMultibodyLink *_x;
  int dof;
  btQuaternion *in_stack_ffffffffffffff70;
  btMultibodyLink *this_00;
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50 [20];
  
  (in_RDI->m_basis).m_el[0].m_floats[0] = 1.0;
  btVector3::btVector3((btVector3 *)((in_RDI->m_basis).m_el[0].m_floats + 1));
  (in_RDI->m_basis).m_el[1].m_floats[1] = -NAN;
  local_50[0x11] = 0.0;
  local_50[0x10] = 0.0;
  local_50[0xf] = 0.0;
  local_50[0xe] = 1.0;
  btQuaternion::btQuaternion
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(btScalar *)in_RDI,
             in_stack_ffffffffffffff58,(btScalar *)0x243c2b);
  btVector3::btVector3((btVector3 *)((in_RDI->m_basis).m_el[2].m_floats + 2));
  btVector3::btVector3((btVector3 *)((in_RDI->m_origin).m_floats + 2));
  btSpatialMotionVector::btSpatialMotionVector((btSpatialMotionVector *)in_RDI);
  btSpatialMotionVector::btSpatialMotionVector((btSpatialMotionVector *)in_RDI);
  _x = (btMultibodyLink *)(in_RDI[5].m_basis.m_el[0].m_floats + 2);
  this_00 = (btMultibodyLink *)(in_RDI[2].m_basis.m_el[0].m_floats + 2);
  do {
    _z = this_00;
    btSpatialMotionVector::btSpatialMotionVector((btSpatialMotionVector *)in_RDI);
    this_00 = (btMultibodyLink *)((_z->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
  } while (this_00 != _x);
  local_50[0xd] = 0.0;
  local_50[0xc] = 0.0;
  local_50[0xb] = 0.0;
  local_50[10] = 1.0;
  btQuaternion::btQuaternion
            ((btQuaternion *)this_00,&_x->m_mass,(btScalar *)in_RDI,&_z->m_mass,(btScalar *)0x243d0d
            );
  dof = (int)((ulong)_x >> 0x20);
  btVector3::btVector3(in_RDI[5].m_basis.m_el + 2);
  btVector3::btVector3(&in_RDI[5].m_origin);
  btVector3::btVector3((btVector3 *)(in_RDI + 6));
  btVector3::btVector3(in_RDI[6].m_basis.m_el + 1);
  btVector3::btVector3(in_RDI[6].m_basis.m_el + 2);
  pbVar1 = in_RDI[7].m_basis.m_el;
  pbVar1[2].m_floats[2] = 0.0;
  pbVar1[2].m_floats[3] = 0.0;
  in_RDI[7].m_origin.m_floats[0] = 0.0;
  in_RDI[7].m_origin.m_floats[1] = 0.0;
  in_RDI[7].m_origin.m_floats[2] = 0.0;
  in_RDI[7].m_origin.m_floats[3] = 7.00649e-45;
  in_RDI[8].m_basis.m_el[0].m_floats[0] = 0.0;
  in_RDI[8].m_basis.m_el[0].m_floats[1] = 0.0;
  btTransform::btTransform(in_RDI);
  in_RDI[9].m_basis.m_el[0].m_floats[2] = 0.0;
  in_RDI[9].m_basis.m_el[0].m_floats[3] = 0.0;
  in_RDI[9].m_basis.m_el[1].m_floats[0] = 0.0;
  in_RDI[9].m_basis.m_el[1].m_floats[1] = 0.0;
  local_50[9] = 1.0;
  local_50[8] = 1.0;
  local_50[7] = 1.0;
  btVector3::setValue((btVector3 *)((in_RDI->m_basis).m_el[0].m_floats + 1),local_50 + 9,
                      local_50 + 8,local_50 + 7);
  local_50[6] = 0.0;
  local_50[5] = 0.0;
  local_50[4] = 0.0;
  setAxisTop(this_00,dof,(btScalar *)in_RDI,&_z->m_mass,(btScalar *)0x243e44);
  local_50[3] = 1.0;
  local_50[2] = 0.0;
  local_50[1] = 0.0;
  setAxisBottom(this_00,dof,(btScalar *)in_RDI,&_z->m_mass,(btScalar *)0x243e7f);
  local_50[0] = 0.0;
  local_54 = 0.0;
  local_58 = 0.0;
  btVector3::setValue((btVector3 *)((in_RDI->m_basis).m_el[2].m_floats + 2),local_50,&local_54,
                      &local_58);
  local_5c = 0.0;
  local_60 = 0.0;
  local_64 = 0.0;
  btVector3::setValue((btVector3 *)((in_RDI->m_origin).m_floats + 2),&local_5c,&local_60,&local_64);
  local_68 = 0.0;
  local_6c = 0.0;
  local_70 = 0.0;
  btVector3::setValue(in_RDI[5].m_basis.m_el + 2,&local_68,&local_6c,&local_70);
  local_74 = 0.0;
  local_78 = 0.0;
  local_7c = 0.0;
  btVector3::setValue(&in_RDI[5].m_origin,&local_74,&local_78,&local_7c);
  local_80 = 0.0;
  local_84 = 0.0;
  local_88 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI + 6),&local_80,&local_84,&local_88);
  in_RDI[7].m_basis.m_el[0].m_floats[2] = 0.0;
  in_RDI[7].m_basis.m_el[0].m_floats[1] = 0.0;
  in_RDI[7].m_basis.m_el[0].m_floats[0] = 0.0;
  in_RDI[6].m_origin.m_floats[2] = 0.0;
  in_RDI[6].m_origin.m_floats[1] = 0.0;
  in_RDI[6].m_origin.m_floats[0] = 0.0;
  in_RDI[6].m_origin.m_floats[3] = 1.0;
  in_RDI[7].m_basis.m_el[2].m_floats[0] = 0.0;
  in_RDI[7].m_basis.m_el[1].m_floats[3] = 0.0;
  in_RDI[7].m_basis.m_el[1].m_floats[2] = 0.0;
  in_RDI[7].m_basis.m_el[1].m_floats[1] = 0.0;
  in_RDI[7].m_basis.m_el[1].m_floats[0] = 0.0;
  in_RDI[7].m_basis.m_el[0].m_floats[3] = 0.0;
  btTransform::setIdentity((btTransform *)this_00);
  return;
}

Assistant:

btMultibodyLink()
		: 	m_mass(1),
			m_parent(-1),
			m_zeroRotParentToThis(0, 0, 0, 1),
			m_cachedRotParentToThis(0, 0, 0, 1),
			m_collider(0),
			m_flags(0),
			m_dofCount(0),
			m_posVarCount(0),
			m_jointType(btMultibodyLink::eInvalid),
			m_jointFeedback(0),
			m_linkName(0),
			m_jointName(0)
	{
		
		m_inertiaLocal.setValue(1, 1, 1);
		setAxisTop(0, 0., 0., 0.);
		setAxisBottom(0, 1., 0., 0.);
		m_dVector.setValue(0, 0, 0);
		m_eVector.setValue(0, 0, 0);
		m_cachedRVector.setValue(0, 0, 0);
		m_appliedForce.setValue( 0, 0, 0);
		m_appliedTorque.setValue(0, 0, 0);
		//		
		m_jointPos[0] = m_jointPos[1] = m_jointPos[2] = m_jointPos[4] = m_jointPos[5] = m_jointPos[6] = 0.f;
		m_jointPos[3] = 1.f;			//"quat.w"
		m_jointTorque[0] = m_jointTorque[1] = m_jointTorque[2] = m_jointTorque[3] = m_jointTorque[4] = m_jointTorque[5] = 0.f;
		m_cachedWorldTransform.setIdentity();
	}